

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_gather_single(bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,
                 bsc_size_t size)

{
  bsp_pid_t bVar1;
  undefined4 local_58;
  undefined4 local_54;
  char *dst_bytes;
  bsc_pid_t m;
  bsc_pid_t P;
  bsc_pid_t i;
  group_t *g;
  bsc_size_t size_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_54 = bsp_nprocs();
  }
  else {
    local_54 = *group;
  }
  bVar1 = bsp_pid();
  if (bVar1 == root) {
    for (m = 0; m < local_54; m = m + 1) {
      if (group == (bsc_group_t)0x0) {
        local_58 = m;
      }
      else {
        local_58 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)m * 4);
      }
      bsc_get(depends,local_58,src,0,(void *)((long)dst + (long)(m * size)),size);
    }
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_gather_single( bsc_step_t depends, 
                       bsc_pid_t root, bsc_group_t group,
                       const void * src, void *dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    if ( bsp_pid() == root ) {
        for ( i = 0; i < P; ++i ) {
            bsc_pid_t m = g?g->gid[i]:i;
            char * dst_bytes = dst;
            bsc_get( depends, m, src, 0, dst_bytes + i * size, size );
        }
    }

    return depends + 1;
}